

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::iterate
          (SamplePosRasterizationTest *this)

{
  size_type *psVar1;
  ostringstream *this_00;
  TestLog *log;
  RenderContext *context;
  pointer pVVar2;
  TestContext *this_01;
  bool bVar3;
  int i;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  long *plVar7;
  TextureFormat *pTVar8;
  undefined8 *puVar9;
  undefined4 extraout_var;
  long lVar10;
  pointer pTVar11;
  RenderTarget *pRVar12;
  long *plVar13;
  TextureFormat TVar14;
  ulong *puVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  IterateResult IVar20;
  long lVar21;
  Vector<float,_4> res_2;
  Vec4 offset;
  ScopedLogSection section;
  TriangleSceneSpec scene;
  Surface glSurface;
  Vector<float,_4> res;
  TextureFormat local_338;
  TextureFormat TStack_330;
  ulong local_328;
  TextureFormat TStack_320;
  string local_318;
  undefined8 local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  string local_2d0;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0;
  long lStack_298;
  ScopedLogSection local_290;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_288;
  Surface local_270;
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  TextureFormat local_1a8;
  int aiStack_1a0 [2];
  TextureFormat local_198;
  float afStack_190 [2];
  float local_188 [12];
  bool local_158 [16];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar6 = this->m_iteration;
  tcu::Surface::Surface(&local_270,this->m_canvasSize,this->m_canvasSize);
  local_288.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad == '\0') {
    _GLOBAL__N_1::SamplePosRasterizationTest::iterate();
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,iVar6 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x996e40);
  local_2f0 = &local_2e0;
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_2e0 = *plVar13;
    lStack_2d8 = plVar7[3];
  }
  else {
    local_2e0 = *plVar13;
    local_2f0 = (long *)*plVar7;
  }
  local_2e8 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pTVar8 = (TextureFormat *)std::__cxx11::string::append((char *)&local_2f0);
  TVar14 = (TextureFormat)(pTVar8 + 2);
  if (*pTVar8 == TVar14) {
    local_328 = *(ulong *)TVar14;
    TStack_320 = pTVar8[3];
    local_338 = (TextureFormat)&local_328;
  }
  else {
    local_328 = *(ulong *)TVar14;
    local_338 = *pTVar8;
  }
  TStack_330 = pTVar8[1];
  *pTVar8 = TVar14;
  pTVar8[1].order = R;
  pTVar8[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar8[2].order = R;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_samples);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar18 = 0xf;
  if (local_338 != (TextureFormat)&local_328) {
    uVar18 = local_328;
  }
  if (uVar18 < (ulong)(local_230 + (long)TStack_330)) {
    uVar18 = 0xf;
    if (local_238 != local_228) {
      uVar18 = local_228[0];
    }
    if (uVar18 < (ulong)(local_230 + (long)TStack_330)) goto LAB_004f2142;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_338);
  }
  else {
LAB_004f2142:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_238);
  }
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_318.field_2._M_allocated_capacity = *psVar1;
    local_318.field_2._8_8_ = puVar9[3];
  }
  else {
    local_318.field_2._M_allocated_capacity = *psVar1;
    local_318._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_318._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,iVar6 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x996e40);
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_208 = *plVar13;
    lStack_200 = plVar7[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar13;
    local_218 = (long *)*plVar7;
  }
  local_210 = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar15 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar15) {
    local_2a0 = *puVar15;
    lStack_298 = plVar7[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *puVar15;
    local_2b0 = (ulong *)*plVar7;
  }
  local_2a8 = plVar7[1];
  *plVar7 = (long)puVar15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_samples);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar18 = 0xf;
  if (local_2b0 != &local_2a0) {
    uVar18 = local_2a0;
  }
  if (uVar18 < (ulong)(local_250 + local_2a8)) {
    uVar18 = 0xf;
    if (local_258 != local_248) {
      uVar18 = local_248[0];
    }
    if ((ulong)(local_250 + local_2a8) <= uVar18) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2b0);
      goto LAB_004f23a8;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_258);
LAB_004f23a8:
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2d0.field_2._M_allocated_capacity = *psVar1;
    local_2d0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar1;
    local_2d0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2d0._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_290,log,&local_318,&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if (local_338 != (TextureFormat)&local_328) {
    operator_delete((void *)local_338,local_328 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar10 + 0xb8))(0x9100,this->m_texID);
  (**(code **)(lVar10 + 0xd8))(this->m_vaoID);
  (**(code **)(lVar10 + 0x40))(0x8892,this->m_vboID);
  (**(code **)(lVar10 + 0x150))
            (0x8892,0x40,
             (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
             fullscreenQuad,0x88e4);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1ee);
  (**(code **)(lVar10 + 0x1a00))(0,0,this->m_canvasSize);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  (**(code **)(lVar10 + 0x19f0))(this->m_samplerProgramPosLoc,4,0x1406,0,0,0);
  (**(code **)(lVar10 + 0x610))(this->m_samplerProgramPosLoc);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1f5);
  (**(code **)(lVar10 + 0x1680))((this->m_samplerProgram->m_program).m_program);
  (**(code **)(lVar10 + 0x14f0))(this->m_samplerProgramSamplerLoc,0);
  (**(code **)(lVar10 + 0x14f0))(this->m_samplerProgramSampleNdxLoc,iVar6);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"useprogram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1fa);
  local_1b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Reading from texture with sample index ",0x27);
  std::ostream::operator<<(this_00,iVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar10 + 0x538))(5,0,4);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1ff);
  (**(code **)(lVar10 + 0x518))(this->m_samplerProgramPosLoc);
  (**(code **)(lVar10 + 0x1680))(0);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x203);
  (**(code **)(lVar10 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_318._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_270.m_pixels.m_cap != (void *)0x0) {
    local_270.m_pixels.m_cap = (size_t)local_270.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_318,local_270.m_width,
             local_270.m_height,1,(void *)local_270.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b8);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x207);
  tcu::TestLog::endSection(local_290.m_log);
  pVVar2 = (this->m_samplePositions).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_338.type = (ChannelType)(pVVar2[iVar6].m_data[1] + -0.5);
  local_338.order = (ChannelOrder)(pVVar2[iVar6].m_data[0] + -0.5);
  TStack_330.order = R;
  TStack_330.type = SNORM_INT8;
  local_2f0 = (long *)CONCAT44((float)this->m_canvasSize,(float)this->m_canvasSize);
  local_2e8 = 0x3f8000003f800000;
  local_1b8._0_4_ = R;
  local_1b8._4_4_ = SNORM_INT8;
  local_1b8._8_4_ = 0;
  local_1b8._12_4_ = 0;
  lVar10 = 0;
  do {
    *(float *)(local_1b8 + lVar10 * 4) =
         (float)(&local_338.order)[lVar10] / *(float *)((long)&local_2f0 + lVar10 * 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_318._M_dataplus._M_p = (pointer)0x0;
  local_318._M_string_length = 0;
  lVar10 = 0;
  do {
    *(float *)((long)&local_318._M_dataplus._M_p + lVar10 * 4) =
         *(float *)(local_1b8 + lVar10 * 4) + *(float *)(local_1b8 + lVar10 * 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  pTVar11 = (this->m_testTriangles).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_testTriangles).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11) >> 4) *
          -0x55555555) {
    lVar19 = 0x10;
    lVar17 = 0x20;
    lVar10 = 0;
    lVar21 = 0;
    do {
      local_188[8] = 0.0;
      local_188[9] = 0.0;
      local_188[10] = 0.0;
      local_188[0xb] = 0.0;
      local_188[4] = 0.0;
      local_188[5] = 0.0;
      local_188[6] = 0.0;
      local_188[7] = 0.0;
      local_188[0] = 0.0;
      local_188[1] = 0.0;
      local_188[2] = 0.0;
      local_188[3] = 0.0;
      local_1b8._0_4_ = R;
      local_1b8._4_4_ = SNORM_INT8;
      local_1b8._8_4_ = 0;
      local_1b8._12_4_ = 0;
      local_338.order = R;
      local_338.type = SNORM_INT8;
      TStack_330.order = 0;
      TStack_330.type = 0;
      lVar16 = 0;
      do {
        (&local_338.order)[lVar16] =
             (ChannelOrder)
             (*(float *)((long)(pTVar11->p1).m_data + lVar16 * 4 + lVar10) -
             *(float *)((long)&local_318._M_dataplus._M_p + lVar16 * 4));
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      local_1b8._0_4_ = local_338.order;
      local_1b8._4_4_ = local_338.type;
      local_1b8._8_4_ = TStack_330.order;
      local_1b8._12_4_ = TStack_330.type;
      local_338.order = R;
      local_338.type = SNORM_INT8;
      TStack_330.order = 0;
      TStack_330.type = 0;
      lVar16 = 0;
      do {
        (&local_338.order)[lVar16] =
             (ChannelOrder)
             (*(float *)((long)(pTVar11->p1).m_data + lVar16 * 4 + lVar19) -
             *(float *)((long)&local_318._M_dataplus._M_p + lVar16 * 4));
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      local_1a8 = local_338;
      aiStack_1a0[0] = TStack_330.order;
      aiStack_1a0[1] = TStack_330.type;
      local_338.order = R;
      local_338.type = SNORM_INT8;
      TStack_330.order = R;
      TStack_330.type = SNORM_INT8;
      lVar16 = 0;
      do {
        (&local_338.order)[lVar16] =
             (ChannelOrder)
             (*(float *)((long)(pTVar11->p1).m_data + lVar16 * 4 + lVar17) -
             *(float *)((long)&local_318._M_dataplus._M_p + lVar16 * 4));
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      local_198 = local_338;
      afStack_190[0] = (float)TStack_330.order;
      afStack_190[1] = (float)TStack_330.type;
      local_158[0] = false;
      local_158[1] = false;
      local_158[2] = false;
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back(&local_288,(value_type *)local_1b8);
      lVar21 = lVar21 + 1;
      pTVar11 = (this->m_testTriangles).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x30;
      lVar19 = lVar19 + 0x30;
      lVar17 = lVar17 + 0x30;
    } while (lVar21 < (int)((ulong)((long)(this->m_testTriangles).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11
                                   ) >> 4) * -0x55555555);
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_1b8._8_4_ = (pRVar12->m_pixelFormat).redBits;
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_1b8._12_4_ = (pRVar12->m_pixelFormat).greenBits;
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_1a8.order = (pRVar12->m_pixelFormat).blueBits;
  local_1b8._0_8_ = (ulong)(uint)this->m_subpixelBits << 0x20;
  bVar3 = tcu::verifyTriangleGroupRasterization
                    (&local_270,(TriangleSceneSpec *)&local_288,(RasterizationArguments *)local_1b8,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     VERIFICATIONMODE_STRICT);
  if (local_288.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_270);
  bVar3 = (bool)(bVar3 & this->m_allIterationsOk);
  this->m_allIterationsOk = bVar3;
  iVar6 = this->m_iteration + 1;
  this->m_iteration = iVar6;
  IVar20 = CONTINUE;
  if (this->m_samples <= iVar6) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3 == false) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Pixel comparison failed");
      IVar20 = STOP;
    }
    else {
      IVar20 = STOP;
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"Pass");
    }
  }
  return IVar20;
}

Assistant:

SamplePosRasterizationTest::IterateResult SamplePosRasterizationTest::iterate (void)
{
	m_allIterationsOk &= testMultisampleTexture(m_iteration);
	m_iteration++;

	if (m_iteration < m_samples)
		return CONTINUE;

	// End result
	if (m_allIterationsOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Pixel comparison failed");

	return STOP;
}